

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::detail::Dispatch_Function::build_type_infos
          (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           *t_funcs)

{
  bool bVar1;
  element_type *peVar2;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *pvVar3;
  Type_Info *pTVar4;
  reference pvVar5;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  size_t i;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> param_types;
  bool size_mismatch;
  const_iterator *end;
  const_iterator begin;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *type_infos;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_ffffffffffffff48;
  reference in_stack_ffffffffffffff50;
  Type_Info *in_stack_ffffffffffffff58;
  Type_Info *pTVar6;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffff70;
  type_info *local_78;
  type_info *local_70;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Type_Info *in_stack_ffffffffffffffa0;
  Type_Info *this;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_48;
  byte local_2a;
  undefined1 local_29;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *local_28;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> **local_20;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
       std::
       vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
       ::cbegin(in_stack_ffffffffffffff48);
  local_28 = (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
             std::
             vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::cend(in_stack_ffffffffffffff48);
  local_20 = &local_28;
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                      *)in_stack_ffffffffffffff50,
                     (__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                      *)in_stack_ffffffffffffff48);
  if (bVar1) {
    local_29 = 0;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
    ::operator*(local_18);
    peVar2 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x228a69);
    chaiscript::dispatch::Proxy_Function_Base::get_param_types(peVar2);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
               in_stack_ffffffffffffffa0,
               (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
    ::operator++(local_18);
    local_2a = 0;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                               *)in_stack_ffffffffffffff50,
                              (__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                               *)in_stack_ffffffffffffff48), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::operator*(local_18);
      peVar2 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x228ac6);
      chaiscript::dispatch::Proxy_Function_Base::get_param_types(peVar2);
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                 in_stack_ffffffffffffffa0,
                 (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffff70 =
           (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
           std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                     (&local_48);
      pvVar3 = (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
               std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                         (in_RDI);
      if (in_stack_ffffffffffffff70 != pvVar3) {
        local_2a = 1;
      }
      this = (Type_Info *)0x0;
      while( true ) {
        pTVar6 = this;
        pTVar4 = (Type_Info *)
                 std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                           (in_RDI);
        in_stack_ffffffffffffff6f = false;
        in_stack_ffffffffffffffa0 = pTVar6;
        if (this < pTVar4) {
          pTVar4 = (Type_Info *)
                   std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                             (&local_48);
          in_stack_ffffffffffffff6f = pTVar6 < pTVar4;
          in_stack_ffffffffffffff58 = pTVar6;
        }
        if ((bool)in_stack_ffffffffffffff6f == false) break;
        in_stack_ffffffffffffff50 =
             std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                       (in_RDI,(size_type)in_stack_ffffffffffffffa0);
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::operator[]
                  (&local_48,(size_type)in_stack_ffffffffffffffa0);
        bVar1 = Type_Info::operator==(this,in_stack_ffffffffffffff58);
        if (!bVar1) {
          Get_Type_Info<chaiscript::Boxed_Value>::get();
          pvVar5 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                   operator[](in_RDI,(size_type)in_stack_ffffffffffffffa0);
          pvVar5->m_type_info = local_78;
          pvVar5->m_bare_type_info = local_70;
          pvVar5->m_flags = in_stack_ffffffffffffff98;
        }
        this = (Type_Info *)((long)&in_stack_ffffffffffffffa0->m_type_info + 1);
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::operator++(local_18);
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
                ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)this);
    }
    if ((local_2a & 1) != 0) {
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::resize
                (in_stack_ffffffffffffff70,
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    }
  }
  else {
    memset(in_RDI,0,0x18);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)0x228c99);
  }
  return in_RDI;
}

Assistant:

static std::vector<Type_Info> build_type_infos(const std::vector<Proxy_Function> &t_funcs)
        {
          auto begin = t_funcs.cbegin();
          const auto &end = t_funcs.cend();

          if (begin != end)
          {
            std::vector<Type_Info> type_infos = (*begin)->get_param_types();

            ++begin;

            bool size_mismatch = false;

            while (begin != end)
            {
              std::vector<Type_Info> param_types = (*begin)->get_param_types();

              if (param_types.size() != type_infos.size())
              {
                size_mismatch = true;
              }

              for (size_t i = 0; i < type_infos.size() && i < param_types.size(); ++i)
              {
                if (!(type_infos[i] == param_types[i]))
                {
                  type_infos[i] = detail::Get_Type_Info<Boxed_Value>::get();
                }
              }

              ++begin;
            }

            assert(type_infos.size() > 0 && " type_info vector size is < 0, this is only possible if something else is broken");

            if (size_mismatch)
            {
              type_infos.resize(1);
            }

            return type_infos;
          }

          return std::vector<Type_Info>();
        }